

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Ant * __thiscall
Ant::step(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
         vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
         vector<Gate,_std::allocator<Gate>_> *gates)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Pheromone PVar6;
  double dVar7;
  double dVar8;
  
  uVar3._0_4_ = this->x;
  uVar3._4_4_ = this->y;
  PVar6 = this->t;
  dVar7 = (double)(PVar6.x - (undefined4)uVar3);
  dVar8 = (double)(PVar6.y - uVar3._4_4_);
  dVar7 = SQRT(dVar8 * dVar8 + dVar7 * dVar7);
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    updatePh(this,walls,pheromones,gates);
    uVar3 = (ulong)(uint)this->x;
    PVar6.y = 0;
    PVar6.x = (this->t).x;
  }
  iVar1 = this->y;
  iVar4 = (this->t).y;
  iVar2 = (int)uVar3;
  if (PVar6.x == iVar2) {
    iVar5 = iVar4;
    if (iVar4 == iVar1) {
LAB_00106210:
      iVar4 = iVar5;
      iVar5 = this->direction;
    }
    else {
      iVar5 = (uint)(iVar1 <= iVar4) * 2 + 1;
      this->direction = iVar5;
      iVar4 = iVar1;
    }
  }
  else {
    iVar5 = iVar1;
    if (iVar4 != iVar1) goto LAB_00106210;
    iVar5 = (uint)(iVar2 <= PVar6.x) * 2;
    this->direction = iVar5;
  }
  switch(iVar5) {
  case 0:
    iVar2 = iVar2 + -1;
    break;
  case 1:
    iVar4 = iVar4 + -1;
    goto LAB_0010623d;
  case 2:
    iVar2 = iVar2 + 1;
    break;
  case 3:
    iVar4 = iVar4 + 1;
LAB_0010623d:
    this->y = iVar4;
  default:
    goto switchD_0010622a_default;
  }
  this->x = iVar2;
switchD_0010622a_default:
  return this;
}

Assistant:

Ant& step(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            if (dist({ t.x, t.y }, { x, y }) == 0)
                updatePh(walls, pheromones, gates);

            if (t.x == x && t.y != y && (direction != 1 || direction != 3))
                setFacing(t.y < y ? 1 : 3);
            else if (t.y == y && t.x != x && (direction != 0 || direction != 2))
                setFacing(t.x < x ? 0 : 2);

            switch(direction) {
                case 0:
                    x--;
                    break;
                case 1:
                    y--;
                    break;
                case 2:
                    x++;
                    break;
                case 3:
                    y++;
                    break;
                default:
                    break;
            }
            return *this;
        }